

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O1

void __thiscall FTagManager::HashTags(FTagManager *this)

{
  uint *puVar1;
  uint uVar2;
  FTagItem *pFVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  int *piVar7;
  int *piVar8;
  
  TArray<FTagItem,_FTagItem>::Grow(&this->allTags,1);
  pFVar3 = (this->allTags).Array;
  uVar2 = (this->allTags).Count;
  pFVar3[uVar2].nexttag = -1;
  pFVar3 = pFVar3 + uVar2;
  pFVar3->target = -1;
  pFVar3->tag = -1;
  puVar1 = &(this->allTags).Count;
  *puVar1 = *puVar1 + 1;
  TArray<FTagItem,_FTagItem>::Grow(&this->allIDs,1);
  pFVar3 = (this->allIDs).Array;
  uVar2 = (this->allIDs).Count;
  pFVar3[uVar2].nexttag = -1;
  pFVar3 = pFVar3 + uVar2;
  pFVar3->target = -1;
  pFVar3->tag = -1;
  uVar2 = (this->allIDs).Count;
  (this->allIDs).Count = uVar2 + 1;
  piVar7 = this->TagHashFirst;
  memset(piVar7,0xff,0x800);
  uVar5 = (this->allTags).Count - 1;
  if (-1 < (int)uVar5) {
    piVar8 = &(this->allTags).Array[uVar5].nexttag;
    uVar6 = (ulong)uVar5;
    do {
      if (-1 < ((FTagItem *)(piVar8 + -2))->target) {
        *piVar8 = piVar7[(byte)piVar8[-1]];
        piVar7[(byte)piVar8[-1]] = (int)uVar6;
      }
      piVar8 = piVar8 + -3;
      bVar4 = 0 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar4);
  }
  if (-1 < (int)uVar2) {
    piVar7 = &(this->allIDs).Array[uVar2].nexttag;
    uVar6 = (ulong)uVar2;
    do {
      if (-1 < ((FTagItem *)(piVar7 + -2))->target) {
        *piVar7 = this->IDHashFirst[(byte)piVar7[-1]];
        this->IDHashFirst[(byte)piVar7[-1]] = (int)uVar6;
      }
      piVar7 = piVar7 + -3;
      bVar4 = 0 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void FTagManager::HashTags()
{
	// add an end marker so we do not need to check for the array's size in the other functions.
	static FTagItem it = { -1, -1, -1 };
	allTags.Push(it);
	allIDs.Push(it);

	// Initially make all slots empty.
	memset(TagHashFirst, -1, sizeof(TagHashFirst));
	memset(IDHashFirst, -1, sizeof(IDHashFirst));

	// Proceed from last to first so that lower targets appear first
	for (int i = allTags.Size() - 1; i >= 0; i--)
	{
		if (allTags[i].target >= 0)	// only link valid entries
		{
			int hash = ((unsigned int)allTags[i].tag) % FTagManager::TAG_HASH_SIZE;
			allTags[i].nexttag = TagHashFirst[hash];
			TagHashFirst[hash] = i;
		}
	}

	for (int i = allIDs.Size() - 1; i >= 0; i--)
	{
		if (allIDs[i].target >= 0)	// only link valid entries
		{
			int hash = ((unsigned int)allIDs[i].tag) % FTagManager::TAG_HASH_SIZE;
			allIDs[i].nexttag = IDHashFirst[hash];
			IDHashFirst[hash] = i;
		}
	}

}